

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_MobjTarget(FParser *this)

{
  FState *newstate;
  AActor *pAVar1;
  AActor *pAVar2;
  
  if (this->t_argc < 1) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  pAVar1 = actorvalue(this->t_argv);
  if ((this->t_argc < 2) ||
     (pAVar2 = actorvalue(this->t_argv + 1), pAVar2 == (AActor *)0x0 || pAVar1 == (AActor *)0x0)) {
    (this->t_return).type = 2;
    if (pAVar1 != (AActor *)0x0) goto LAB_00506cb2;
  }
  else {
    newstate = pAVar1->SeeState;
    if (newstate != (FState *)0x0) {
      (pAVar1->target).field_0.p = pAVar2;
      AActor::SetState(pAVar1,newstate,false);
      *(byte *)&(pAVar1->flags).Value = (byte)(pAVar1->flags).Value | 0x40;
    }
    (this->t_return).type = 2;
LAB_00506cb2:
    pAVar1 = (pAVar1->target).field_0.p;
    if (pAVar1 != (AActor *)0x0) {
      pAVar2 = (AActor *)0x0;
      if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar2 = pAVar1;
      }
      goto LAB_00506ce8;
    }
  }
  pAVar2 = (AActor *)0x0;
LAB_00506ce8:
  (this->t_return).value.mobj = pAVar2;
  return;
}

Assistant:

void FParser::SF_MobjTarget(void)
{
	AActor*  mo;
	AActor*  target;
	
	if (CheckArgs(1))
	{
		mo = actorvalue(t_argv[0]);
		if(t_argc > 1)
		{
			target = actorvalue(t_argv[1]);
			if(mo && target && mo->SeeState) // haleyjd: added target check -- no NULL allowed
			{
				mo->target=target;
				mo->SetState(mo->SeeState);
				mo->flags|=MF_JUSTHIT;
			}
		}
		
		t_return.type = svt_mobj;
		t_return.value.mobj = mo ? mo->target : NULL;
	}
}